

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O2

int GetFormatGap(int drive_speed,DataRate datarate,Encoding encoding,int sectors,int size_)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (sectors == 0) {
    return 0;
  }
  lVar5 = 0x14;
  while( true ) {
    if (lVar5 == 0x5c) {
      iVar3 = GetTrackCapacity(drive_speed,datarate,encoding);
      iVar4 = Sector::SizeCodeToLength(size_);
      iVar1 = iVar4 + 0x3e;
      iVar2 = iVar3 + -0x92;
      if (encoding != MFM) {
        iVar1 = iVar4 + 0x21;
        iVar2 = iVar3 + -0x49;
      }
      iVar4 = iVar2 / sectors - iVar1;
      iVar3 = 0x52;
      if (iVar4 < 0x52) {
        iVar3 = iVar4;
      }
      iVar4 = 0;
      if (iVar1 < iVar2 / sectors) {
        iVar4 = iVar3;
      }
      return iVar4;
    }
    if ((((*(int *)("FitTrack: unable to fit " + lVar5 + 5) == drive_speed) &&
         (*(DataRate *)("FitTrack: unable to fit " + lVar5 + 9) == datarate)) &&
        (*(Encoding *)("FitTrack: unable to fit " + lVar5 + 0xd) == encoding)) &&
       ((*(int *)("FitTrack: unable to fit " + lVar5 + 0x11) == sectors &&
        (*(int *)("FitTrack: unable to fit " + lVar5 + 0x15) == size_)))) break;
    lVar5 = lVar5 + 0x18;
  }
  return *(int *)((long)&standard_gaps[0].drivespeed + lVar5);
}

Assistant:

int GetFormatGap(int drive_speed, DataRate datarate, Encoding encoding, int sectors, int size_)
{
    if (!sectors) return 0;

    // Check for common formats that use specific gap sizes
    for (auto& fg : standard_gaps)
    {
        // If the format matches exactly, return the known gap
        if (fg.drivespeed == drive_speed && fg.datarate == datarate && fg.encoding == encoding &&
            fg.sectors == sectors && fg.size == size_)
            return fg.gap3;
    }

    auto track_len = GetTrackCapacity(drive_speed, datarate, encoding) - GetTrackOverhead(encoding);
    auto chunk = track_len / sectors;
    auto overhead = Sector::SizeCodeToLength(size_) + GetSectorOverhead(encoding);
    auto gap3 = (chunk > overhead) ? chunk - overhead : 0;
    return (gap3 > MAX_GAP3) ? MAX_GAP3 : gap3;
}